

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.c
# Opt level: O2

bool_t memTest(void)

{
  octet *poVar1;
  octet *dest;
  octet *poVar2;
  long lVar3;
  bool_t bVar4;
  int iVar5;
  void *buf_00;
  void *pvVar6;
  size_t sVar7;
  long lVar8;
  undefined8 uStack_60;
  octet buf [16];
  octet buf1 [16];
  octet buf2 [16];
  
  uStack_60 = 0x103d5f;
  memSet(buf,'\0',0x10);
  uStack_60 = 0x103d6a;
  bVar4 = memIsValid(buf,0x10);
  if (bVar4 != 0) {
    uStack_60 = 0x103d7d;
    bVar4 = memIsValid((void *)0x0,0);
    if (bVar4 != 0) {
      uStack_60 = 0x103d8d;
      buf_00 = memAlloc(100);
      if (buf_00 != (void *)0x0) {
        uStack_60 = 0x103da7;
        memSet(buf_00,'\a',100);
        uStack_60 = 0x103db2;
        pvVar6 = memRealloc(buf_00,0x66);
        if (pvVar6 != (void *)0x0) {
          uStack_60 = 0x103dcc;
          bVar4 = memIsRep(pvVar6,100,'\a');
          buf_00 = pvVar6;
          if (bVar4 != 0) {
            uStack_60 = 0x103ddf;
            pvVar6 = memRealloc(pvVar6,0x5a);
            if (pvVar6 != (void *)0x0) {
              uStack_60 = 0x103df8;
              bVar4 = memIsRep(pvVar6,0x5a,'\a');
              buf_00 = pvVar6;
              if (bVar4 != 0) {
                uStack_60 = 0x103e06;
                buf_00 = memRealloc(pvVar6,0);
                if (buf_00 == (void *)0x0) {
                  uStack_60 = 0x103e18;
                  memFree((void *)0x0);
                  uStack_60 = 0x103e2d;
                  memSet(buf,'\f',0x10);
                  uStack_60 = 0x103e3d;
                  memCopy(buf1,buf,0x10);
                  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
                    if (buf1[lVar8] != buf[lVar8]) {
                      return 0;
                    }
                    buf1[lVar8] = (octet)lVar8;
                    buf[lVar8] = (octet)lVar8;
                  }
                  poVar1 = buf + 1;
                  uStack_60 = 0x103e92;
                  memMove(buf,poVar1,0xf);
                  dest = buf1 + 1;
                  uStack_60 = 0x103ea7;
                  memMove(dest,buf1,0xf);
                  lVar8 = 2;
                  while (lVar8 != 0x10) {
                    poVar2 = buf1 + lVar8;
                    lVar3 = lVar8 + -2;
                    lVar8 = lVar8 + 1;
                    if (*poVar2 != buf[lVar3]) {
                      return 0;
                    }
                  }
                  uStack_60 = 0x103edc;
                  memCopy(buf1,(void *)0x0,0);
                  uStack_60 = 0x103ee8;
                  memMove(buf1,(void *)0x0,0);
                  uStack_60 = 0x103efa;
                  hexTo(buf,"000102030405060708090A0B0C0D0E0F");
                  uStack_60 = 0x103f09;
                  hexTo(buf1,"F00102030405060708090A0B0C0D0EFF");
                  uStack_60 = 0x103f14;
                  bVar4 = memIsZero(buf,0xf);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f27;
                  bVar4 = memIsZero_fast(buf,0xf);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f3a;
                  bVar4 = memIsZero_fast(buf,3);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f50;
                  bVar4 = memEq(poVar1,dest,0xf);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f66;
                  bVar4 = memEq_fast(poVar1,dest,0xf);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f86;
                  bVar4 = memEq(buf + 8,buf1 + 8,8);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103f9c;
                  bVar4 = memEq_fast(buf + 8,buf1 + 8,8);
                  if (bVar4 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x103fb2;
                  bVar4 = memEq(poVar1,dest,8);
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x103fc8;
                  bVar4 = memEq_fast(poVar1,dest,8);
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x103fde;
                  bVar4 = memEq(poVar1,dest,0xe);
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x103ff4;
                  bVar4 = memEq_fast(poVar1,dest,0xe);
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x10400c;
                  iVar5 = memCmp(buf,buf1,7);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104025;
                  iVar5 = memCmp_fast(buf,buf1,7);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10403e;
                  iVar5 = memCmpRev(buf,buf1,7);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104057;
                  iVar5 = memCmpRev_fast(buf,buf1,7);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104070;
                  iVar5 = memCmp(buf,buf1,0xf);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104089;
                  iVar5 = memCmp_fast(buf,buf1,0xf);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1040a2;
                  iVar5 = memCmpRev(buf,buf1,0xf);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1040bb;
                  iVar5 = memCmpRev_fast(buf,buf1,0xf);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x1040d4;
                  iVar5 = memCmp(buf1,buf,0xf);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1040ed;
                  iVar5 = memCmp_fast(buf1,buf,0xf);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104106;
                  iVar5 = memCmpRev(buf1,buf,0xf);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10411f;
                  iVar5 = memCmpRev_fast(buf1,buf,0xf);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104138;
                  iVar5 = memCmp(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104151;
                  iVar5 = memCmp_fast(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10416a;
                  iVar5 = memCmpRev(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104183;
                  iVar5 = memCmpRev_fast(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10419c;
                  iVar5 = memCmp(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1041b5;
                  iVar5 = memCmp_fast(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1041ce;
                  iVar5 = memCmpRev(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1041e7;
                  iVar5 = memCmpRev_fast(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1041fe;
                  iVar5 = memCmp(poVar1,dest,8);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104214;
                  iVar5 = memCmp_fast(poVar1,dest,8);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x10422a;
                  iVar5 = memCmp(poVar1,dest,0xe);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104240;
                  iVar5 = memCmp_fast(poVar1,dest,0xe);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104256;
                  iVar5 = memCmpRev(poVar1,dest,8);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x10426c;
                  iVar5 = memCmpRev_fast(poVar1,dest,8);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104282;
                  iVar5 = memCmpRev(poVar1,dest,0xe);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x104298;
                  iVar5 = memCmpRev_fast(poVar1,dest,0xe);
                  if (iVar5 != 0) {
                    return 0;
                  }
                  uStack_60 = 0x1042b2;
                  memRev(buf,0xf);
                  uStack_60 = 0x1042bd;
                  sVar7 = memNonZeroSize(buf,0xf);
                  if (sVar7 != 0xe) {
                    return 0;
                  }
                  uStack_60 = 0x1042d9;
                  hexTo(buf,"F001020304050607");
                  uStack_60 = 0x1042ed;
                  hexTo(buf1,"00010203040506F7");
                  uStack_60 = 0x1042fb;
                  iVar5 = memCmp(buf,buf1,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104314;
                  iVar5 = memCmp_fast(buf,buf1,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10432d;
                  iVar5 = memCmp(buf1,buf,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104346;
                  iVar5 = memCmp_fast(buf1,buf,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x10435f;
                  iVar5 = memCmpRev(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104378;
                  iVar5 = memCmpRev_fast(buf,buf1,8);
                  if (iVar5 != -1) {
                    return 0;
                  }
                  uStack_60 = 0x104391;
                  iVar5 = memCmpRev(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1043aa;
                  iVar5 = memCmpRev_fast(buf1,buf,8);
                  if (iVar5 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1043c5;
                  hexTo(buf,"01010101010101010102");
                  uStack_60 = 0x1043d3;
                  bVar4 = memIsRep(buf,7,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x1043ea;
                  bVar4 = memIsRep_fast(buf,7,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104401;
                  bVar4 = memIsRep(buf,8,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104418;
                  bVar4 = memIsRep_fast(buf,8,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10442f;
                  bVar4 = memIsRep(buf,9,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x104446;
                  bVar4 = memIsRep_fast(buf,9,'\x01');
                  if (bVar4 != 1) {
                    return 0;
                  }
                  uStack_60 = 0x10445d;
                  bVar4 = memIsRep(buf,10,'\x01');
                  if (bVar4 == 1) {
                    return 0;
                  }
                  uStack_60 = 0x104474;
                  bVar4 = memIsRep_fast(buf,10,'\x01');
                  if (bVar4 == 1) {
                    return 0;
                  }
                  uStack_60 = 0x10448f;
                  hexTo(buf,"0001020304050607");
                  uStack_60 = 0x1044a9;
                  memJoin(buf,poVar1,3,buf + 3,4);
                  uStack_60 = 0x1044b8;
                  bVar4 = hexEq(buf,"01020303040506");
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1044d2;
                  hexTo(buf,"0001020304050607");
                  uStack_60 = 0x1044e7;
                  memJoin(buf,poVar1,3,poVar1,4);
                  uStack_60 = 0x1044f6;
                  bVar4 = hexEq(buf,"01020301020304");
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104510;
                  hexTo(buf,"0001020304050607");
                  poVar1 = buf + 2;
                  uStack_60 = 0x10452a;
                  memJoin(buf,buf + 3,4,poVar1,2);
                  uStack_60 = 0x104539;
                  bVar4 = hexEq(buf,"030405060203");
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104553;
                  hexTo(buf,"0001020304050607");
                  uStack_60 = 0x10456a;
                  memJoin(poVar1,buf,4,buf + 4,2);
                  uStack_60 = 0x104579;
                  bVar4 = hexEq(poVar1,"000102030405");
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x104593;
                  hexTo(buf,"000102030405060708");
                  uStack_60 = 0x1045a7;
                  hexTo(buf1,"F0F1F2F3F4F5F6F7F8");
                  uStack_60 = 0x1045c1;
                  memXor(buf2,buf,buf1,9);
                  uStack_60 = 0x1045d1;
                  bVar4 = memIsRep(buf2,9,0xf0);
                  if (bVar4 == 0) {
                    return 0;
                  }
                  uStack_60 = 0x1045ee;
                  memXor2(buf2,buf1,9);
                  uStack_60 = 0x104600;
                  memXor2(buf2,buf,8);
                  uStack_60 = 0x10460d;
                  bVar4 = memIsRep(buf2,8,'\0');
                  return (uint)(buf2[8] == '\b' && bVar4 != 0);
                }
              }
            }
          }
        }
        uStack_60 = 0x103e6c;
        memFree(buf_00);
      }
    }
  }
  return 0;
}

Assistant:

bool_t memTest()
{
	octet buf[16];
	octet buf1[16];
	octet buf2[16];
	void* p;
	void* p1;
	size_t i;
	// pre
	CASSERT(sizeof(buf) == sizeof(buf1));
	memSetZero(buf, sizeof(buf));
	if (!memIsValid(buf, sizeof(buf)) || !memIsValid(0, 0))
		return FALSE;
	// alloc (считаем, что памяти хватает)
	p = memAlloc(100);
	if (!p)
		return FALSE;
	memSet(p, 7, 100);
	if (!(p1 = memRealloc(p, 102)) || 
		!memIsRep(p = p1, 100, 7) ||
		!(p1 = memRealloc(p, 90)) || 
		!memIsRep(p = p1, 90, 7) ||
		(p = memRealloc(p, 0)))
	{
		memFree(p);
		return FALSE;
	}
	memFree(p);
	// заполнение / копирование
	memSet(buf, 12, sizeof(buf));
	memCopy(buf1, buf, sizeof(buf));
	for (i = 0; i < sizeof(buf); ++i)
	{
		if (buf1[i] != buf[i])
			return FALSE;
		buf[i] = buf1[i] = i % 256u;
	}
	memMove(buf, buf + 1, sizeof(buf) - 1);
	memMove(buf1 + 1, buf1, sizeof(buf1) - 1);
	for (i = 0; i < sizeof(buf) - 2; ++i)
	{
		if (buf1[i + 2] != buf[i])
			return FALSE;
	}
	memCopy(buf1, 0, 0);
	memMove(buf1, 0, 0);
	// сравнение
	hexTo(buf,  "000102030405060708090A0B0C0D0E0F");
	hexTo(buf1, "F00102030405060708090A0B0C0D0EFF");
	if (SAFE(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 3) ||
		SAFE(memEq)(buf + 1, buf1 + 1, 15) ||
		FAST(memEq)(buf + 1, buf1 + 1, 15) ||
		SAFE(memEq)(buf + 8, buf1 + 8, 8) ||
		FAST(memEq)(buf + 8, buf1 + 8, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 8) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 14) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 14) ||
		SAFE(memCmp)(buf, buf1, 7) != -1 ||
		FAST(memCmp)(buf, buf1, 7) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 7) != -1 ||
		FAST(memCmpRev)(buf, buf1, 7) != -1 ||
		SAFE(memCmp)(buf, buf1, 15) != -1 ||
		FAST(memCmp)(buf, buf1, 15) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 15) != -1 ||
		FAST(memCmpRev)(buf, buf1, 15) != -1 ||
		SAFE(memCmp)(buf1, buf, 15) != 1 ||
		FAST(memCmp)(buf1, buf, 15) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 15) != 1 ||
		FAST(memCmpRev)(buf1, buf, 15) != 1 ||
		SAFE(memCmp)(buf, buf1, 8) != -1 ||
		FAST(memCmp)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmp)(buf1, buf, 8) != 1 ||
		FAST(memCmp)(buf1, buf, 8) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 14) != 0)
		return FALSE;
	memRev(buf, 15);
	if (memNonZeroSize(buf, 15) != 14)
		return FALSE;
	hexTo(buf,  "F001020304050607");
	hexTo(buf1, "00010203040506F7");
	if (SAFE(memCmp)(buf, buf1, 8) != 1 ||
		FAST(memCmp)(buf, buf1, 8) != 1 ||
		SAFE(memCmp)(buf1, buf, 8) != -1 ||
		FAST(memCmp)(buf1, buf, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1)
		return FALSE;
	hexTo(buf, "01010101010101010102");
	if (SAFE(memIsRep)(buf, 7, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 7, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 8, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 8, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 9, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 9, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 10, 0x01) == TRUE ||
		FAST(memIsRep)(buf, 10, 0x01) == TRUE)
		return FALSE;
	// join
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 3, 4);
	if (!hexEq(buf, "01020303040506"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 1, 4);
	if (!hexEq(buf, "01020301020304"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 3, 4, buf + 2, 2);
	if (!hexEq(buf, "030405060203"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf + 2, buf, 4, buf + 4, 2);
	if (!hexEq(buf + 2, "000102030405"))
		return FALSE;
	// xor
	hexTo(buf, "000102030405060708");
	hexTo(buf1, "F0F1F2F3F4F5F6F7F8");
	memXor(buf2, buf, buf1, 9);
	if (!memIsRep(buf2, 9, 0xF0))
		return FALSE;
	memXor2(buf2, buf1, 9);
	memXor2(buf2, buf, 8);
	if (!memIsRep(buf2, 8, 0) || buf2[8] != 0x08)
		return FALSE;
	// все нормально
	return TRUE;
}